

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<float>::RepeatedField
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  float *__dest;
  float *__src;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->current_size_ != 0) {
    Reserve(this,other->current_size_);
    AddNAlreadyReserved(this,other->current_size_);
    __dest = Mutable(this,0);
    __src = Get(other,0);
    memcpy(__dest,__src,(long)other->current_size_ << 2);
    return;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}